

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O0

void write_value_table(double *values,double *space_coordinates,uint space_nodes,char *filename)

{
  size_t sVar1;
  uint uStack_2004c;
  char acStack_20048 [4];
  uint space_step;
  char iteration_buffer [32];
  char values_to_string [131072];
  char *filename_local;
  uint space_nodes_local;
  double *space_coordinates_local;
  double *values_local;
  
  memset(iteration_buffer + 0x18,0,0x20000);
  memset(acStack_20048,0,0x20);
  for (uStack_2004c = 0; uStack_2004c < space_nodes; uStack_2004c = uStack_2004c + 1) {
    snprintf(acStack_20048,0x20,"%.6lf %.6lf\n",space_coordinates[uStack_2004c],values[uStack_2004c]
            );
    sVar1 = strlen(iteration_buffer + 0x18);
    strncat(iteration_buffer + 0x18,acStack_20048,0x1ffff - sVar1);
  }
  rewrite_file(filename,iteration_buffer + 0x18);
  return;
}

Assistant:

void write_value_table (double const * values,
                        double const * space_coordinates,
                        unsigned space_nodes,
                        char * filename) {

  char values_to_string[MAX_BUFFER_SIZE] = "";

  char iteration_buffer[SMALL_BUFFER_SIZE] = "";

  unsigned space_step = 0;

  for (space_step = 0; space_step < space_nodes; ++space_step) {
    snprintf (iteration_buffer, 
              SMALL_BUFFER_SIZE, 
              "%.6lf %.6lf\n", 
              space_coordinates[space_step], 
              values[space_step]);
    strncat (values_to_string, iteration_buffer, MAX_BUFFER_SIZE - strlen(values_to_string) - 1);
  }

  rewrite_file (filename, values_to_string);
  return;
}